

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

u32 HighsHashHelpers::modexp_M31(u32 a,u64 e)

{
  ulong in_RSI;
  u32 in_EDI;
  u32 unaff_retaddr;
  u32 result;
  undefined4 local_14;
  undefined8 local_10;
  
  local_14 = in_EDI;
  for (local_10 = in_RSI; local_10 != 1; local_10 = local_10 >> 1) {
    local_14 = multiply_modM31(result,unaff_retaddr);
    if ((local_10 & 1) != 0) {
      local_14 = multiply_modM31(result,unaff_retaddr);
    }
  }
  return local_14;
}

Assistant:

static u32 modexp_M31(u32 a, u64 e) {
    // the exponent need to be greater than zero
    assert(e > 0);
    u32 result = a;

    while (e != 1) {
      // square
      result = multiply_modM31(result, result);

      // multiply with a if exponent is odd
      if (e & 1) result = multiply_modM31(result, a);

      // shift to next bit
      e = e >> 1;
    }

    return result;
  }